

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GenNativeTableUnPack
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  FieldDef *s;
  StructDef *def;
  bool bVar1;
  reference ppFVar2;
  char *__rhs;
  string local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  string local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  string local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  string local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  undefined1 local_698 [8];
  string field_table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined4 local_174;
  undefined1 local_170 [8];
  string length;
  string field_var;
  string field_field;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_100;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string struct_type;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  struct_type.field_2._8_8_ = code_ptr;
  IdlNamer::Type_abi_cxx11_((string *)local_48,&this->namer_,struct_def);
  std::operator+(&local_c8,"func (rcv *",(string *)local_48);
  std::operator+(&local_a8,&local_c8,") UnPackTo(t *");
  NativeName_abi_cxx11_((string *)&it,this,struct_def);
  std::operator+(&local_88,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
  std::operator+(&local_68,&local_88,") {\n");
  std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  local_100._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  do {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_100,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) {
      std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"}\n\n");
      std::operator+(&local_8f8,"func (rcv *",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::operator+(&local_8d8,&local_8f8,") UnPack() *");
      NativeName_abi_cxx11_(&local_918,this,struct_def);
      std::operator+(&local_8b8,&local_8d8,&local_918);
      std::operator+(&local_898,&local_8b8," {\n");
      std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_898);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::__cxx11::string::~string((string *)&local_918);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::__cxx11::string::operator+=
                ((string *)struct_type.field_2._8_8_,"\tif rcv == nil {\n\t\treturn nil\n\t}\n");
      NativeName_abi_cxx11_(&local_978,this,struct_def);
      std::operator+(&local_958,"\tt := &",&local_978);
      std::operator+(&local_938,&local_958,"{}\n");
      std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_938);
      std::__cxx11::string::~string((string *)&local_938);
      std::__cxx11::string::~string((string *)&local_958);
      std::__cxx11::string::~string((string *)&local_978);
      std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\trcv.UnPackTo(t)\n");
      std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\treturn t\n");
      std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"}\n\n");
      std::__cxx11::string::~string((string *)local_48);
      return;
    }
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_100);
    s = *ppFVar2;
    if ((s->deprecated & 1U) == 0) {
      IdlNamer::Field_abi_cxx11_((string *)((long)&field_var.field_2 + 8),&this->namer_,s);
      IdlNamer::Variable_abi_cxx11_((string *)((long)&length.field_2 + 8),&this->namer_,s);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&length.field_2 + 8),"Length");
      bVar1 = IsScalar((s->value).type.base_type);
      if (bVar1) {
        if (((s->value).type.enum_def == (EnumDef *)0x0) ||
           ((((s->value).type.enum_def)->is_union & 1U) == 0)) {
          std::operator+(&local_1f8,"\tt.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_var.field_2 + 8));
          std::operator+(&local_1d8,&local_1f8," = rcv.");
          std::operator+(&local_1b8,&local_1d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_var.field_2 + 8));
          std::operator+(&local_198,&local_1b8,"()\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_198)
          ;
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1f8);
          goto LAB_00293494;
        }
        local_174 = 4;
      }
      else {
        bVar1 = IsString(&(s->value).type);
        if (bVar1) {
          std::operator+(&local_278,"\tt.",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_var.field_2 + 8));
          std::operator+(&local_258,&local_278," = string(rcv.");
          std::operator+(&local_238,&local_258,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_var.field_2 + 8));
          std::operator+(&local_218,&local_238,"())\n");
          std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_218)
          ;
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_278);
        }
        else {
          bVar1 = IsVector(&(s->value).type);
          if (((bVar1) && ((s->value).type.element == BASE_TYPE_UCHAR)) &&
             ((s->value).type.enum_def == (EnumDef *)0x0)) {
            std::operator+(&local_2f8,"\tt.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_var.field_2 + 8));
            std::operator+(&local_2d8,&local_2f8," = rcv.");
            std::operator+(&local_2b8,&local_2d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_var.field_2 + 8));
            std::operator+(&local_298,&local_2b8,"Bytes()\n");
            std::__cxx11::string::operator+=
                      ((string *)struct_type.field_2._8_8_,(string *)&local_298);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::__cxx11::string::~string((string *)&local_2f8);
          }
          else {
            bVar1 = IsVector(&(s->value).type);
            if (bVar1) {
              std::operator+(&local_378,"\t",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_170);
              std::operator+(&local_358,&local_378," := rcv.");
              std::operator+(&local_338,&local_358,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_var.field_2 + 8));
              std::operator+(&local_318,&local_338,"Length()\n");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_318);
              std::__cxx11::string::~string((string *)&local_318);
              std::__cxx11::string::~string((string *)&local_338);
              std::__cxx11::string::~string((string *)&local_358);
              std::__cxx11::string::~string((string *)&local_378);
              std::operator+(&local_438,"\tt.",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_var.field_2 + 8));
              std::operator+(&local_418,&local_438," = make(");
              NativeType_abi_cxx11_(&local_458,this,&(s->value).type);
              std::operator+(&local_3f8,&local_418,&local_458);
              std::operator+(&local_3d8,&local_3f8,", ");
              std::operator+(&local_3b8,&local_3d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_170);
              std::operator+(&local_398,&local_3b8,")\n");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_398);
              std::__cxx11::string::~string((string *)&local_398);
              std::__cxx11::string::~string((string *)&local_3b8);
              std::__cxx11::string::~string((string *)&local_3d8);
              std::__cxx11::string::~string((string *)&local_3f8);
              std::__cxx11::string::~string((string *)&local_458);
              std::__cxx11::string::~string((string *)&local_418);
              std::__cxx11::string::~string((string *)&local_438);
              std::operator+(&local_498,"\tfor j := 0; j < ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_170);
              std::operator+(&local_478,&local_498,"; j++ {\n");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_478);
              std::__cxx11::string::~string((string *)&local_478);
              std::__cxx11::string::~string((string *)&local_498);
              if ((s->value).type.element == BASE_TYPE_STRUCT) {
                def = (s->value).type.struct_def;
                WrapInNameSpaceAndTrack(&local_4f8,this,&def->super_Definition,(string *)def);
                std::operator+(&local_4d8,"\t\tx := ",&local_4f8);
                std::operator+(&local_4b8,&local_4d8,"{}\n");
                std::__cxx11::string::operator+=
                          ((string *)struct_type.field_2._8_8_,(string *)&local_4b8);
                std::__cxx11::string::~string((string *)&local_4b8);
                std::__cxx11::string::~string((string *)&local_4d8);
                std::__cxx11::string::~string((string *)&local_4f8);
                std::operator+(&local_538,"\t\trcv.",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&field_var.field_2 + 8));
                std::operator+(&local_518,&local_538,"(&x, j)\n");
                std::__cxx11::string::operator+=
                          ((string *)struct_type.field_2._8_8_,(string *)&local_518);
                std::__cxx11::string::~string((string *)&local_518);
                std::__cxx11::string::~string((string *)&local_538);
              }
              std::operator+(&local_578,"\t\tt.",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_var.field_2 + 8));
              std::operator+(&local_558,&local_578,"[j] = ");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_558);
              std::__cxx11::string::~string((string *)&local_558);
              std::__cxx11::string::~string((string *)&local_578);
              bVar1 = IsScalar((s->value).type.element);
              if (bVar1) {
                std::operator+(&local_5b8,"rcv.",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&field_var.field_2 + 8));
                std::operator+(&local_598,&local_5b8,"(j)");
                std::__cxx11::string::operator+=
                          ((string *)struct_type.field_2._8_8_,(string *)&local_598);
                std::__cxx11::string::~string((string *)&local_598);
                std::__cxx11::string::~string((string *)&local_5b8);
              }
              else if ((s->value).type.element == BASE_TYPE_STRING) {
                std::operator+(&local_5f8,"string(rcv.",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&field_var.field_2 + 8));
                std::operator+(&local_5d8,&local_5f8,"(j))");
                std::__cxx11::string::operator+=
                          ((string *)struct_type.field_2._8_8_,(string *)&local_5d8);
                std::__cxx11::string::~string((string *)&local_5d8);
                std::__cxx11::string::~string((string *)&local_5f8);
              }
              else {
                if ((s->value).type.element != BASE_TYPE_STRUCT) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                                ,0x4f0,
                                "void flatbuffers::go::GoGenerator::GenNativeTableUnPack(const StructDef &, std::string *)"
                               );
                }
                std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"x.UnPack()");
              }
              std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\n");
              std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\t}\n");
            }
            else if ((s->value).type.base_type == BASE_TYPE_STRUCT) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_table.field_2 + 8),"\tt.",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_var.field_2 + 8));
              std::operator+(&local_658,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_table.field_2 + 8)," = rcv.");
              std::operator+(&local_638,&local_658,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_var.field_2 + 8));
              std::operator+(&local_618,&local_638,"(nil).UnPack()\n");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_618);
              std::__cxx11::string::~string((string *)&local_618);
              std::__cxx11::string::~string((string *)&local_638);
              std::__cxx11::string::~string((string *)&local_658);
              std::__cxx11::string::~string((string *)(field_table.field_2._M_local_buf + 8));
            }
            else {
              if ((s->value).type.base_type != BASE_TYPE_UNION) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                              ,0x501,
                              "void flatbuffers::go::GoGenerator::GenNativeTableUnPack(const StructDef &, std::string *)"
                             );
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_698,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&length.field_2 + 8),"Table");
              std::operator+(&local_6d8,"\t",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_698);
              std::operator+(&local_6b8,&local_6d8," := flatbuffers.Table{}\n");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_6b8);
              std::__cxx11::string::~string((string *)&local_6b8);
              std::__cxx11::string::~string((string *)&local_6d8);
              Namer::Method<flatbuffers::FieldDef>(&local_778,&(this->namer_).super_Namer,s);
              std::operator+(&local_758,"\tif rcv.",&local_778);
              std::operator+(&local_738,&local_758,"(&");
              std::operator+(&local_718,&local_738,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_698);
              std::operator+(&local_6f8,&local_718,") {\n");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_6f8);
              std::__cxx11::string::~string((string *)&local_6f8);
              std::__cxx11::string::~string((string *)&local_718);
              std::__cxx11::string::~string((string *)&local_738);
              std::__cxx11::string::~string((string *)&local_758);
              std::__cxx11::string::~string((string *)&local_778);
              std::operator+(&local_838,"\t\tt.",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&field_var.field_2 + 8));
              std::operator+(&local_818,&local_838," = rcv.");
              __rhs = UnionTypeFieldSuffix();
              std::operator+(&local_878,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s,
                             __rhs);
              Namer::Method(&local_858,&(this->namer_).super_Namer,&local_878);
              std::operator+(&local_7f8,&local_818,&local_858);
              std::operator+(&local_7d8,&local_7f8,"().UnPack(");
              std::operator+(&local_7b8,&local_7d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_698);
              std::operator+(&local_798,&local_7b8,")\n");
              std::__cxx11::string::operator+=
                        ((string *)struct_type.field_2._8_8_,(string *)&local_798);
              std::__cxx11::string::~string((string *)&local_798);
              std::__cxx11::string::~string((string *)&local_7b8);
              std::__cxx11::string::~string((string *)&local_7d8);
              std::__cxx11::string::~string((string *)&local_7f8);
              std::__cxx11::string::~string((string *)&local_858);
              std::__cxx11::string::~string((string *)&local_878);
              std::__cxx11::string::~string((string *)&local_818);
              std::__cxx11::string::~string((string *)&local_838);
              std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"\t}\n");
              std::__cxx11::string::~string((string *)local_698);
            }
          }
        }
LAB_00293494:
        local_174 = 0;
      }
      std::__cxx11::string::~string((string *)local_170);
      std::__cxx11::string::~string((string *)(length.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(field_var.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_100);
  } while( true );
}

Assistant:

void GenNativeTableUnPack(const StructDef &struct_def,
                            std::string *code_ptr) {
    std::string &code = *code_ptr;
    const std::string struct_type = namer_.Type(struct_def);

    code += "func (rcv *" + struct_type + ") UnPackTo(t *" +
            NativeName(struct_def) + ") {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      const std::string field_field = namer_.Field(field);
      const std::string field_var = namer_.Variable(field);
      const std::string length = field_var + "Length";
      if (IsScalar(field.value.type.base_type)) {
        if (field.value.type.enum_def != nullptr &&
            field.value.type.enum_def->is_union)
          continue;
        code += "\tt." + field_field + " = rcv." + field_field + "()\n";
      } else if (IsString(field.value.type)) {
        code += "\tt." + field_field + " = string(rcv." + field_field + "())\n";
      } else if (IsVector(field.value.type) &&
                 field.value.type.element == BASE_TYPE_UCHAR &&
                 field.value.type.enum_def == nullptr) {
        code += "\tt." + field_field + " = rcv." + field_field + "Bytes()\n";
      } else if (IsVector(field.value.type)) {
        code += "\t" + length + " := rcv." + field_field + "Length()\n";
        code += "\tt." + field_field + " = make(" +
                NativeType(field.value.type) + ", " + length + ")\n";
        code += "\tfor j := 0; j < " + length + "; j++ {\n";
        if (field.value.type.element == BASE_TYPE_STRUCT) {
          code += "\t\tx := " +
                  WrapInNameSpaceAndTrack(field.value.type.struct_def,
                                          field.value.type.struct_def->name) +
                  "{}\n";
          code += "\t\trcv." + field_field + "(&x, j)\n";
        }
        code += "\t\tt." + field_field + "[j] = ";
        if (IsScalar(field.value.type.element)) {
          code += "rcv." + field_field + "(j)";
        } else if (field.value.type.element == BASE_TYPE_STRING) {
          code += "string(rcv." + field_field + "(j))";
        } else if (field.value.type.element == BASE_TYPE_STRUCT) {
          code += "x.UnPack()";
        } else {
          // TODO(iceboy): Support vector of unions.
          FLATBUFFERS_ASSERT(0);
        }
        code += "\n";
        code += "\t}\n";
      } else if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        code +=
            "\tt." + field_field + " = rcv." + field_field + "(nil).UnPack()\n";
      } else if (field.value.type.base_type == BASE_TYPE_UNION) {
        const std::string field_table = field_var + "Table";
        code += "\t" + field_table + " := flatbuffers.Table{}\n";
        code +=
            "\tif rcv." + namer_.Method(field) + "(&" + field_table + ") {\n";
        code += "\t\tt." + field_field + " = rcv." +
                namer_.Method(field.name + UnionTypeFieldSuffix()) +
                "().UnPack(" + field_table + ")\n";
        code += "\t}\n";
      } else {
        FLATBUFFERS_ASSERT(0);
      }
    }
    code += "}\n\n";

    code += "func (rcv *" + struct_type + ") UnPack() *" +
            NativeName(struct_def) + " {\n";
    code += "\tif rcv == nil {\n\t\treturn nil\n\t}\n";
    code += "\tt := &" + NativeName(struct_def) + "{}\n";
    code += "\trcv.UnPackTo(t)\n";
    code += "\treturn t\n";
    code += "}\n\n";
  }